

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_avx_functor::binary_op_atan2>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined8 uVar39;
  undefined8 uVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  float fVar54;
  float fVar55;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar56 [32];
  __m128 _outp_1;
  __m128 _p_1;
  __m128 _b;
  __m256 _outp;
  __m256 _p;
  __m256 _b_avx;
  int i;
  int size;
  binary_op_atan2 op;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_1;
  __m128 negative_mask_full_x_1;
  __m128 normal_result_1;
  __m128 pi_additions_1;
  __m128 negative_mask_y_1;
  __m128 negative_mask_x_1;
  __m128 normal_mode_1;
  __m128 not_equal_zero_y_1;
  __m128 not_equal_zero_x_1;
  __m128 magic_half_pi_2;
  __m128 magic_pi_1;
  __m128 magic_negative_zero_2;
  __m128 magic_zero_1;
  __m128 output_approx_1;
  __m128 fourth_power_of_input_approx_1;
  __m128 square_of_input_approx_1;
  __m128 input_approx_1;
  __m128 is_small_input_1;
  __m128 absolute_1;
  __m128 negative_mask_1;
  __m128 magic_a8_1;
  __m128 magic_a7_1;
  __m128 magic_a6_1;
  __m128 magic_a5_1;
  __m128 magic_a4_1;
  __m128 magic_a3_1;
  __m128 magic_a2_1;
  __m128 magic_a1_1;
  __m128 magic_a0_1;
  __m128 magic_half_pi_3;
  __m128 magic_negative_one_1;
  __m128 magic_one_1;
  __m128 magic_negative_zero_3;
  undefined8 local_2670;
  undefined8 uStack_2668;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  int local_25d4;
  undefined8 *local_25c0;
  undefined1 (*local_25b0) [32];
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  float local_22c0;
  float fStack_22bc;
  float fStack_22b8;
  float fStack_22b4;
  float fStack_22b0;
  float fStack_22ac;
  float fStack_22a8;
  float fStack_22a4;
  float local_22a0;
  float fStack_229c;
  float fStack_2298;
  float fStack_2294;
  float fStack_2290;
  float fStack_228c;
  float fStack_2288;
  float fStack_2284;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  float local_1a20;
  float fStack_1a1c;
  float fStack_1a18;
  float fStack_1a14;
  float fStack_1a10;
  float fStack_1a0c;
  float fStack_1a08;
  float fStack_1a04;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  float local_15c0;
  float fStack_15bc;
  float fStack_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  float fStack_15a8;
  float fStack_15a4;
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  float local_12c0;
  float fStack_12bc;
  float fStack_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float local_1180;
  float fStack_117c;
  float fStack_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  uint local_dc0;
  uint uStack_dbc;
  uint uStack_db8;
  uint uStack_db4;
  uint uStack_db0;
  uint uStack_dac;
  uint uStack_da8;
  uint uStack_da4;
  float local_c30;
  float fStack_c2c;
  float fStack_c28;
  float fStack_c24;
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  
  local_25d4 = 0;
  uVar1 = *in_RSI;
  auVar13 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar1),0x20);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar1),0x30);
  auVar14 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar1),0x20);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar1),0x30);
  uStack_2510 = auVar13._0_8_;
  uStack_2508 = auVar13._8_8_;
  local_25c0 = in_RDX;
  local_25b0 = in_RDI;
  for (; local_25d4 + 7 < in_ECX * in_R8D; local_25d4 = local_25d4 + 8) {
    auVar53._16_8_ = uStack_2510;
    auVar53._0_16_ = auVar14;
    auVar53._24_8_ = uStack_2508;
    auVar52._16_8_ = uStack_2510;
    auVar52._0_16_ = auVar14;
    auVar52._24_8_ = uStack_2508;
    auVar51._16_8_ = uStack_2510;
    auVar51._0_16_ = auVar14;
    auVar51._24_8_ = uStack_2508;
    auVar7._16_8_ = uStack_2510;
    auVar7._0_16_ = auVar14;
    auVar7._24_8_ = uStack_2508;
    auVar13 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x20);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x30);
    auVar15 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0),0x20);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0),0x30);
    uStack_2250 = auVar15._0_8_;
    uStack_2248 = auVar15._8_8_;
    auVar15 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x20);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x30);
    auVar16 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x80000000),0x20);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x80000000),0x30);
    uStack_2210 = auVar16._0_8_;
    uStack_2208 = auVar16._8_8_;
    auVar16 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40490fdb),0x20);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40490fdb),0x30);
    auVar17 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x40490fdb),0x20);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x40490fdb),0x30);
    uStack_21d0 = auVar17._0_8_;
    uStack_21c8 = auVar17._8_8_;
    auVar17 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3fc90fdb),0x20);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3fc90fdb),0x30);
    auVar18 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3fc90fdb),0x20);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3fc90fdb),0x30);
    uStack_2190 = auVar18._0_8_;
    uStack_2188 = auVar18._8_8_;
    auVar6._16_8_ = uStack_2250;
    auVar6._0_16_ = auVar13;
    auVar6._24_8_ = uStack_2248;
    auVar6 = vcmpps_avx(auVar7,auVar6,4);
    auVar2._16_8_ = uStack_2250;
    auVar2._0_16_ = auVar13;
    auVar2._24_8_ = uStack_2248;
    auVar7 = vcmpps_avx(*local_25b0,auVar2,4);
    auVar6 = vandps_avx(auVar6,auVar7);
    auVar10._16_8_ = uStack_2210;
    auVar10._0_16_ = auVar15;
    auVar10._24_8_ = uStack_2208;
    auVar2 = vandps_avx(auVar10,auVar51);
    auVar5._16_8_ = uStack_2210;
    auVar5._0_16_ = auVar15;
    auVar5._24_8_ = uStack_2208;
    auVar3 = vandps_avx(auVar5,*local_25b0);
    auVar9._16_8_ = uStack_2250;
    auVar9._0_16_ = auVar13;
    auVar9._24_8_ = uStack_2248;
    auVar8 = vcmpps_avx(auVar52,auVar9,1);
    auVar9 = vcmpps_avx(*local_25b0,auVar9,1);
    auVar4._16_8_ = uStack_2210;
    auVar4._0_16_ = auVar15;
    auVar4._24_8_ = uStack_2208;
    auVar9 = vandps_avx(auVar9,auVar4);
    auVar42._16_8_ = uStack_21d0;
    auVar42._0_16_ = auVar16;
    auVar42._24_8_ = uStack_21c8;
    auVar9 = vorps_avx(auVar9,auVar42);
    auVar9 = vandps_avx(auVar8,auVar9);
    auVar12 = vdivps_avx(*local_25b0,auVar53);
    auVar15 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x20);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x30);
    auVar18 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x80000000),0x20);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x80000000),0x30);
    uStack_1990 = auVar18._0_8_;
    uStack_1988 = auVar18._8_8_;
    auVar18 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x20);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x30);
    auVar19 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3f800000),0x20);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3f800000),0x30);
    uStack_1950 = auVar19._0_8_;
    uStack_1948 = auVar19._8_8_;
    auVar19 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbf800000),0x20);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbf800000),0x30);
    auVar20 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar20 = vinsertps_avx(auVar20,ZEXT416(0xbf800000),0x20);
    auVar20 = vinsertps_avx(auVar20,ZEXT416(0xbf800000),0x30);
    uStack_1910 = auVar20._0_8_;
    uStack_1908 = auVar20._8_8_;
    auVar20 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x20);
    auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x30);
    auVar21 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3fc90fdb),0x20);
    auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3fc90fdb),0x30);
    uStack_18d0 = auVar21._0_8_;
    uStack_18c8 = auVar21._8_8_;
    auVar21 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x20);
    auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x30);
    auVar22 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x20);
    auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x30);
    auVar23 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbeaaaa53),0x20);
    auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbeaaaa53),0x30);
    auVar24 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar24 = vinsertps_avx(auVar24,ZEXT416(0xbeaaaa53),0x20);
    auVar24 = vinsertps_avx(auVar24,ZEXT416(0xbeaaaa53),0x30);
    auVar25 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3e4cb974),0x20);
    auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3e4cb974),0x30);
    auVar26 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar26 = vinsertps_avx(auVar26,ZEXT416(0x3e4cb974),0x20);
    auVar26 = vinsertps_avx(auVar26,ZEXT416(0x3e4cb974),0x30);
    auVar27 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbe117200),0x20);
    auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbe117200),0x30);
    auVar28 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar28 = vinsertps_avx(auVar28,ZEXT416(0xbe117200),0x20);
    auVar28 = vinsertps_avx(auVar28,ZEXT416(0xbe117200),0x30);
    auVar29 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3dd9ed24),0x20);
    auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3dd9ed24),0x30);
    auVar30 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar30 = vinsertps_avx(auVar30,ZEXT416(0x3dd9ed24),0x20);
    auVar30 = vinsertps_avx(auVar30,ZEXT416(0x3dd9ed24),0x30);
    auVar31 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbd99b01e),0x20);
    auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbd99b01e),0x30);
    auVar32 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar32 = vinsertps_avx(auVar32,ZEXT416(0xbd99b01e),0x20);
    auVar32 = vinsertps_avx(auVar32,ZEXT416(0xbd99b01e),0x30);
    auVar33 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3d2edd4e),0x20);
    auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3d2edd4e),0x30);
    auVar34 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar34 = vinsertps_avx(auVar34,ZEXT416(0x3d2edd4e),0x20);
    auVar34 = vinsertps_avx(auVar34,ZEXT416(0x3d2edd4e),0x30);
    auVar35 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar35 = vinsertps_avx(auVar35,ZEXT416(0xbc83a25c),0x20);
    auVar35 = vinsertps_avx(auVar35,ZEXT416(0xbc83a25c),0x30);
    auVar36 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar36 = vinsertps_avx(auVar36,ZEXT416(0xbc83a25c),0x20);
    auVar36 = vinsertps_avx(auVar36,ZEXT416(0xbc83a25c),0x30);
    auVar37 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar37 = vinsertps_avx(auVar37,ZEXT416(0x3b3ac537),0x20);
    auVar37 = vinsertps_avx(auVar37,ZEXT416(0x3b3ac537),0x30);
    auVar38 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar38 = vinsertps_avx(auVar38,ZEXT416(0x3b3ac537),0x20);
    auVar38 = vinsertps_avx(auVar38,ZEXT416(0x3b3ac537),0x30);
    auVar46._16_8_ = uStack_1990;
    auVar46._0_16_ = auVar15;
    auVar46._24_8_ = uStack_1988;
    auVar8 = vandps_avx(auVar46,auVar12);
    auVar49._16_8_ = uStack_1990;
    auVar49._0_16_ = auVar15;
    auVar49._24_8_ = uStack_1988;
    auVar10 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
    auVar4 = vandnps_avx(auVar49,auVar12);
    auVar43._16_8_ = uStack_1950;
    auVar43._0_16_ = auVar18;
    auVar43._24_8_ = uStack_1948;
    auVar11 = vcmpps_avx(auVar43,auVar4,1);
    auVar45._16_8_ = uStack_1910;
    auVar45._0_16_ = auVar19;
    auVar45._24_8_ = uStack_1908;
    auVar12 = vandps_avx(auVar11,auVar45);
    auVar5 = vandnps_avx(auVar11,auVar4);
    auVar5 = vorps_avx(auVar12,auVar5);
    auVar12 = vandps_avx(auVar11,auVar4);
    auVar48._16_8_ = uStack_1950;
    auVar48._0_16_ = auVar18;
    auVar48._24_8_ = uStack_1948;
    auVar4 = vandnps_avx(auVar11,auVar48);
    auVar12 = vorps_avx(auVar12,auVar4);
    auVar12 = vdivps_avx(auVar5,auVar12);
    local_15c0 = auVar12._0_4_;
    fStack_15bc = auVar12._4_4_;
    fStack_15b8 = auVar12._8_4_;
    fStack_15b4 = auVar12._12_4_;
    fStack_15b0 = auVar12._16_4_;
    fStack_15ac = auVar12._20_4_;
    fStack_15a8 = auVar12._24_4_;
    fStack_15a4 = auVar12._28_4_;
    fVar54 = local_15c0 * local_15c0;
    fVar57 = fStack_15bc * fStack_15bc;
    fVar59 = fStack_15b8 * fStack_15b8;
    fVar61 = fStack_15b4 * fStack_15b4;
    fVar63 = fStack_15b0 * fStack_15b0;
    fVar65 = fStack_15ac * fStack_15ac;
    fVar67 = fStack_15a8 * fStack_15a8;
    fVar55 = fVar54 * fVar54;
    fVar58 = fVar57 * fVar57;
    fVar60 = fVar59 * fVar59;
    fVar62 = fVar61 * fVar61;
    fVar64 = fVar63 * fVar63;
    fVar66 = fVar65 * fVar65;
    fVar68 = fVar67 * fVar67;
    local_10a0 = auVar35._0_4_;
    fStack_109c = auVar35._4_4_;
    fStack_1098 = auVar35._8_4_;
    fStack_1094 = auVar35._12_4_;
    fStack_1090 = auVar36._0_4_;
    fStack_108c = auVar36._4_4_;
    fStack_1088 = auVar36._8_4_;
    local_10e0 = auVar31._0_4_;
    fStack_10dc = auVar31._4_4_;
    fStack_10d8 = auVar31._8_4_;
    fStack_10d4 = auVar31._12_4_;
    fStack_10d0 = auVar32._0_4_;
    fStack_10cc = auVar32._4_4_;
    fStack_10c8 = auVar32._8_4_;
    local_1180 = auVar27._0_4_;
    fStack_117c = auVar27._4_4_;
    fStack_1178 = auVar27._8_4_;
    fStack_1174 = auVar27._12_4_;
    fStack_1170 = auVar28._0_4_;
    fStack_116c = auVar28._4_4_;
    fStack_1168 = auVar28._8_4_;
    local_1220 = auVar23._0_4_;
    fStack_121c = auVar23._4_4_;
    fStack_1218 = auVar23._8_4_;
    fStack_1214 = auVar23._12_4_;
    fStack_1210 = auVar24._0_4_;
    fStack_120c = auVar24._4_4_;
    fStack_1208 = auVar24._8_4_;
    local_1280 = auVar37._0_4_;
    fStack_127c = auVar37._4_4_;
    fStack_1278 = auVar37._8_4_;
    fStack_1274 = auVar37._12_4_;
    fStack_1270 = auVar38._0_4_;
    fStack_126c = auVar38._4_4_;
    fStack_1268 = auVar38._8_4_;
    local_12c0 = auVar33._0_4_;
    fStack_12bc = auVar33._4_4_;
    fStack_12b8 = auVar33._8_4_;
    fStack_12b4 = auVar33._12_4_;
    fStack_12b0 = auVar34._0_4_;
    fStack_12ac = auVar34._4_4_;
    fStack_12a8 = auVar34._8_4_;
    local_1360 = auVar29._0_4_;
    fStack_135c = auVar29._4_4_;
    fStack_1358 = auVar29._8_4_;
    fStack_1354 = auVar29._12_4_;
    fStack_1350 = auVar30._0_4_;
    fStack_134c = auVar30._4_4_;
    fStack_1348 = auVar30._8_4_;
    local_1400 = auVar25._0_4_;
    fStack_13fc = auVar25._4_4_;
    fStack_13f8 = auVar25._8_4_;
    fStack_13f4 = auVar25._12_4_;
    fStack_13f0 = auVar26._0_4_;
    fStack_13ec = auVar26._4_4_;
    fStack_13e8 = auVar26._8_4_;
    local_14a0 = auVar21._0_4_;
    fStack_149c = auVar21._4_4_;
    fStack_1498 = auVar21._8_4_;
    fStack_1494 = auVar21._12_4_;
    fStack_1490 = auVar22._0_4_;
    fStack_148c = auVar22._4_4_;
    fStack_1488 = auVar22._8_4_;
    auVar44._16_8_ = uStack_18d0;
    auVar44._0_16_ = auVar20;
    auVar44._24_8_ = uStack_18c8;
    auVar12 = vandps_avx(auVar11,auVar44);
    local_1a20 = auVar12._0_4_;
    fStack_1a1c = auVar12._4_4_;
    fStack_1a18 = auVar12._8_4_;
    fStack_1a14 = auVar12._12_4_;
    fStack_1a10 = auVar12._16_4_;
    fStack_1a0c = auVar12._20_4_;
    fStack_1a08 = auVar12._24_4_;
    fStack_1a04 = auVar12._28_4_;
    auVar47._4_4_ =
         (fVar57 * (fVar58 * (fVar58 * (fVar58 * fStack_109c + fStack_10dc) + fStack_117c) +
                   fStack_121c) +
         fVar58 * (fVar58 * (fVar58 * (fVar58 * fStack_127c + fStack_12bc) + fStack_135c) +
                  fStack_13fc) + fStack_149c) * fStack_15bc + fStack_1a1c;
    auVar47._0_4_ =
         (fVar54 * (fVar55 * (fVar55 * (fVar55 * local_10a0 + local_10e0) + local_1180) + local_1220
                   ) +
         fVar55 * (fVar55 * (fVar55 * (fVar55 * local_1280 + local_12c0) + local_1360) + local_1400)
         + local_14a0) * local_15c0 + local_1a20;
    auVar47._8_4_ =
         (fVar59 * (fVar60 * (fVar60 * (fVar60 * fStack_1098 + fStack_10d8) + fStack_1178) +
                   fStack_1218) +
         fVar60 * (fVar60 * (fVar60 * (fVar60 * fStack_1278 + fStack_12b8) + fStack_1358) +
                  fStack_13f8) + fStack_1498) * fStack_15b8 + fStack_1a18;
    auVar47._12_4_ =
         (fVar61 * (fVar62 * (fVar62 * (fVar62 * fStack_1094 + fStack_10d4) + fStack_1174) +
                   fStack_1214) +
         fVar62 * (fVar62 * (fVar62 * (fVar62 * fStack_1274 + fStack_12b4) + fStack_1354) +
                  fStack_13f4) + fStack_1494) * fStack_15b4 + fStack_1a14;
    auVar47._16_4_ =
         (fVar63 * (fVar64 * (fVar64 * (fVar64 * fStack_1090 + fStack_10d0) + fStack_1170) +
                   fStack_1210) +
         fVar64 * (fVar64 * (fVar64 * (fVar64 * fStack_1270 + fStack_12b0) + fStack_1350) +
                  fStack_13f0) + fStack_1490) * fStack_15b0 + fStack_1a10;
    auVar47._20_4_ =
         (fVar65 * (fVar66 * (fVar66 * (fVar66 * fStack_108c + fStack_10cc) + fStack_116c) +
                   fStack_120c) +
         fVar66 * (fVar66 * (fVar66 * (fVar66 * fStack_126c + fStack_12ac) + fStack_134c) +
                  fStack_13ec) + fStack_148c) * fStack_15ac + fStack_1a0c;
    auVar47._24_4_ =
         (fVar67 * (fVar68 * (fVar68 * (fVar68 * fStack_1088 + fStack_10c8) + fStack_1168) +
                   fStack_1208) +
         fVar68 * (fVar68 * (fVar68 * (fVar68 * fStack_1268 + fStack_12a8) + fStack_1348) +
                  fStack_13e8) + fStack_1488) * fStack_15a8 + fStack_1a08;
    auVar47._28_4_ = fStack_15a4 + fStack_1a04;
    auVar8 = vorps_avx(auVar47,auVar8);
    local_22a0 = auVar8._0_4_;
    fStack_229c = auVar8._4_4_;
    fStack_2298 = auVar8._8_4_;
    fStack_2294 = auVar8._12_4_;
    fStack_2290 = auVar8._16_4_;
    fStack_228c = auVar8._20_4_;
    fStack_2288 = auVar8._24_4_;
    fStack_2284 = auVar8._28_4_;
    local_22c0 = auVar9._0_4_;
    fStack_22bc = auVar9._4_4_;
    fStack_22b8 = auVar9._8_4_;
    fStack_22b4 = auVar9._12_4_;
    fStack_22b0 = auVar9._16_4_;
    fStack_22ac = auVar9._20_4_;
    fStack_22a8 = auVar9._24_4_;
    fStack_22a4 = auVar9._28_4_;
    auVar41._16_8_ = uStack_21d0;
    auVar41._0_16_ = auVar16;
    auVar41._24_8_ = uStack_21c8;
    auVar2 = vorps_avx(auVar2,auVar41);
    auVar8._16_8_ = uStack_2250;
    auVar8._0_16_ = auVar13;
    auVar8._24_8_ = uStack_2248;
    auVar9 = vcmpps_avx(auVar2,auVar8,1);
    auVar11._16_8_ = uStack_2190;
    auVar11._0_16_ = auVar17;
    auVar11._24_8_ = uStack_2188;
    auVar2 = vorps_avx(auVar3,auVar11);
    auVar2 = vandps_avx(auVar7,auVar2);
    auVar3._16_8_ = uStack_21d0;
    auVar3._0_16_ = auVar16;
    auVar3._24_8_ = uStack_21c8;
    auVar3 = vandps_avx(auVar9,auVar3);
    auVar50._16_8_ = uStack_2250;
    auVar50._0_16_ = auVar13;
    auVar50._24_8_ = uStack_2248;
    auVar9 = vandnps_avx(auVar9,auVar50);
    auVar3 = vorps_avx(auVar3,auVar9);
    auVar3 = vandnps_avx(auVar7,auVar3);
    auVar3 = vorps_avx(auVar2,auVar3);
    auVar12._4_4_ = fStack_229c + fStack_22bc;
    auVar12._0_4_ = local_22a0 + local_22c0;
    auVar12._12_4_ = fStack_2294 + fStack_22b4;
    auVar12._8_4_ = fStack_2298 + fStack_22b8;
    auVar12._20_4_ = fStack_228c + fStack_22ac;
    auVar12._16_4_ = fStack_2290 + fStack_22b0;
    auVar12._28_4_ = fStack_2284 + fStack_22a4;
    auVar12._24_4_ = fStack_2288 + fStack_22a8;
    auVar2 = vandps_avx(auVar6,auVar12);
    local_dc0 = auVar6._0_4_;
    uStack_dbc = auVar6._4_4_;
    uStack_db8 = auVar6._8_4_;
    uStack_db4 = auVar6._12_4_;
    uStack_db0 = auVar6._16_4_;
    uStack_dac = auVar6._20_4_;
    uStack_da8 = auVar6._24_4_;
    uStack_da4 = auVar6._28_4_;
    auVar56._0_4_ = local_dc0 ^ auVar10._0_4_;
    auVar56._4_4_ = uStack_dbc ^ auVar10._4_4_;
    auVar56._8_4_ = uStack_db8 ^ auVar10._8_4_;
    auVar56._12_4_ = uStack_db4 ^ auVar10._12_4_;
    auVar56._16_4_ = uStack_db0 ^ auVar10._16_4_;
    auVar56._20_4_ = uStack_dac ^ auVar10._20_4_;
    auVar56._24_4_ = uStack_da8 ^ auVar10._24_4_;
    auVar56._28_4_ = uStack_da4 ^ auVar10._28_4_;
    auVar6 = vandps_avx(auVar56,auVar3);
    auVar6 = vorps_avx(auVar2,auVar6);
    local_2640 = auVar6._0_8_;
    uStack_2638 = auVar6._8_8_;
    uStack_2630 = auVar6._16_8_;
    uStack_2628 = auVar6._24_8_;
    *local_25c0 = local_2640;
    local_25c0[1] = uStack_2638;
    local_25c0[2] = uStack_2630;
    local_25c0[3] = uStack_2628;
    local_25b0 = local_25b0 + 1;
    local_25c0 = local_25c0 + 4;
  }
  uVar1 = *in_RSI;
  uVar39 = CONCAT44(uVar1,uVar1);
  uVar40 = CONCAT44(uVar1,uVar1);
  for (; local_25d4 + 3 < in_ECX * in_R8D; local_25d4 = local_25d4 + 4) {
    auVar32._8_8_ = uVar40;
    auVar32._0_8_ = uVar39;
    auVar31._8_8_ = uVar40;
    auVar31._0_8_ = uVar39;
    auVar30._8_8_ = uVar40;
    auVar30._0_8_ = uVar39;
    auVar14._8_8_ = uVar40;
    auVar14._0_8_ = uVar39;
    auVar13 = vcmpps_avx(auVar14,ZEXT816(0),4);
    auVar14 = vcmpps_avx(*(undefined1 (*) [16])*local_25b0,ZEXT816(0),4);
    auVar16 = vpand_avx(auVar13,auVar14);
    auVar18._8_8_ = 0x8000000080000000;
    auVar18._0_8_ = 0x8000000080000000;
    auVar17 = vpand_avx(auVar18,auVar30);
    auVar15._8_8_ = 0x8000000080000000;
    auVar15._0_8_ = 0x8000000080000000;
    auVar18 = vpand_avx(auVar15,*(undefined1 (*) [16])*local_25b0);
    auVar13 = vcmpps_avx(auVar31,ZEXT816(0),1);
    auVar15 = vcmpps_avx(*(undefined1 (*) [16])*local_25b0,ZEXT816(0),1);
    auVar19._8_8_ = 0x8000000080000000;
    auVar19._0_8_ = 0x8000000080000000;
    auVar15 = vpand_avx(auVar15,auVar19);
    auVar22._8_8_ = 0x40490fdb40490fdb;
    auVar22._0_8_ = 0x40490fdb40490fdb;
    auVar15 = vpor_avx(auVar15,auVar22);
    auVar19 = vpand_avx(auVar13,auVar15);
    auVar13 = vdivps_avx(*(undefined1 (*) [16])*local_25b0,auVar32);
    auVar23._8_8_ = 0x8000000080000000;
    auVar23._0_8_ = 0x8000000080000000;
    auVar20 = vpand_avx(auVar23,auVar13);
    auVar29._8_8_ = 0x8000000080000000;
    auVar29._0_8_ = 0x8000000080000000;
    auVar23 = vpcmpeqd_avx(auVar22,auVar22);
    auVar21 = vpandn_avx(auVar29,auVar13);
    auVar27._8_8_ = 0x3f8000003f800000;
    auVar27._0_8_ = 0x3f8000003f800000;
    auVar13 = vcmpps_avx(auVar27,auVar21,1);
    auVar25._8_8_ = 0xbf800000bf800000;
    auVar25._0_8_ = 0xbf800000bf800000;
    auVar15 = vpand_avx(auVar13,auVar25);
    auVar22 = vpandn_avx(auVar13,auVar21);
    auVar22 = vpor_avx(auVar15,auVar22);
    auVar15 = vpand_avx(auVar13,auVar21);
    auVar28._8_8_ = 0x3f8000003f800000;
    auVar28._0_8_ = 0x3f8000003f800000;
    auVar21 = vpandn_avx(auVar13,auVar28);
    auVar15 = vpor_avx(auVar15,auVar21);
    auVar15 = vdivps_avx(auVar22,auVar15);
    local_6d0 = auVar15._0_4_;
    fStack_6cc = auVar15._4_4_;
    fStack_6c8 = auVar15._8_4_;
    fStack_6c4 = auVar15._12_4_;
    fVar54 = local_6d0 * local_6d0;
    fVar57 = fStack_6cc * fStack_6cc;
    fVar59 = fStack_6c8 * fStack_6c8;
    fVar61 = fStack_6c4 * fStack_6c4;
    fVar55 = fVar54 * fVar54;
    fVar58 = fVar57 * fVar57;
    fVar60 = fVar59 * fVar59;
    fVar62 = fVar61 * fVar61;
    auVar24._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar24._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar13 = vpand_avx(auVar13,auVar24);
    local_740 = auVar13._0_4_;
    fStack_73c = auVar13._4_4_;
    fStack_738 = auVar13._8_4_;
    fStack_734 = auVar13._12_4_;
    auVar26._4_4_ =
         (fVar57 * (fVar58 * (fVar58 * (fVar58 * -0.01606863 + -0.07504295) + -0.14203644) +
                   -0.33333072) +
         fVar58 * (fVar58 * (fVar58 * (fVar58 * 0.0028498897 + 0.04269152) + 0.10640934) + 0.1999262
                  ) + 1.0) * fStack_6cc + fStack_73c;
    auVar26._0_4_ =
         (fVar54 * (fVar55 * (fVar55 * (fVar55 * -0.01606863 + -0.07504295) + -0.14203644) +
                   -0.33333072) +
         fVar55 * (fVar55 * (fVar55 * (fVar55 * 0.0028498897 + 0.04269152) + 0.10640934) + 0.1999262
                  ) + 1.0) * local_6d0 + local_740;
    auVar26._8_4_ =
         (fVar59 * (fVar60 * (fVar60 * (fVar60 * -0.01606863 + -0.07504295) + -0.14203644) +
                   -0.33333072) +
         fVar60 * (fVar60 * (fVar60 * (fVar60 * 0.0028498897 + 0.04269152) + 0.10640934) + 0.1999262
                  ) + 1.0) * fStack_6c8 + fStack_738;
    auVar26._12_4_ =
         (fVar61 * (fVar62 * (fVar62 * (fVar62 * -0.01606863 + -0.07504295) + -0.14203644) +
                   -0.33333072) +
         fVar62 * (fVar62 * (fVar62 * (fVar62 * 0.0028498897 + 0.04269152) + 0.10640934) + 0.1999262
                  ) + 1.0) * fStack_6c4 + fStack_734;
    auVar13 = vpor_avx(auVar26,auVar20);
    local_c20 = auVar13._0_4_;
    fStack_c1c = auVar13._4_4_;
    fStack_c18 = auVar13._8_4_;
    fStack_c14 = auVar13._12_4_;
    local_c30 = auVar19._0_4_;
    fStack_c2c = auVar19._4_4_;
    fStack_c28 = auVar19._8_4_;
    fStack_c24 = auVar19._12_4_;
    auVar21._8_8_ = 0x40490fdb40490fdb;
    auVar21._0_8_ = 0x40490fdb40490fdb;
    auVar13 = vpor_avx(auVar17,auVar21);
    auVar13 = vcmpps_avx(auVar13,ZEXT816(0),1);
    auVar20._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar20._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar15 = vpor_avx(auVar18,auVar20);
    auVar15 = vpand_avx(auVar14,auVar15);
    auVar17._8_8_ = 0x40490fdb40490fdb;
    auVar17._0_8_ = 0x40490fdb40490fdb;
    auVar17 = vpand_avx(auVar13,auVar17);
    auVar13 = vpandn_avx(auVar13,ZEXT816(0));
    auVar13 = vpor_avx(auVar17,auVar13);
    auVar13 = vpandn_avx(auVar14,auVar13);
    auVar14 = vpor_avx(auVar15,auVar13);
    auVar13._4_4_ = fStack_c1c + fStack_c2c;
    auVar13._0_4_ = local_c20 + local_c30;
    auVar13._12_4_ = fStack_c14 + fStack_c24;
    auVar13._8_4_ = fStack_c18 + fStack_c28;
    auVar13 = vpand_avx(auVar16,auVar13);
    auVar14 = vpand_avx(auVar16 ^ auVar23,auVar14);
    auVar13 = vpor_avx(auVar13,auVar14);
    local_2670 = auVar13._0_8_;
    uStack_2668 = auVar13._8_8_;
    *local_25c0 = local_2670;
    local_25c0[1] = uStack_2668;
    local_25b0 = (undefined1 (*) [32])(*local_25b0 + 0x10);
    local_25c0 = local_25c0 + 2;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}